

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFAcroFormDocumentHelper.cc
# Opt level: O3

void __thiscall
QPDFAcroFormDocumentHelper::addAndRenameFormFields
          (QPDFAcroFormDocumentHelper *this,
          vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *fields)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer pcVar2;
  pointer pQVar3;
  element_type *peVar4;
  _List_node_base *p_Var5;
  uint uVar6;
  bool bVar7;
  uint uVar8;
  QPDFObjGen og;
  reference __args;
  _Node *p_Var9;
  const_iterator cVar10;
  long *plVar11;
  mapped_type *pmVar12;
  long *plVar13;
  ulong *puVar14;
  uint __len;
  uint __uval;
  uint __val;
  pointer pQVar15;
  string append_1;
  iterator __begin4;
  string new_name;
  string __str;
  iterator __end4;
  list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> queue;
  QPDFObjectHandle kids;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  renames;
  set seen;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  QPDFFormFieldObjectHelper local_208;
  undefined1 local_1d0 [16];
  undefined1 local_1c0 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  iterator local_188;
  QPDFAcroFormDocumentHelper *local_160;
  _List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> local_158;
  QPDFObjectHandle local_140;
  QPDFObjectHandle local_130;
  QPDFObjectHandle local_120;
  long *local_110 [2];
  long local_100 [2];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *local_f0;
  QPDFObjectHandle local_e8;
  QPDFObjectHandle local_d8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  local_98;
  QPDFFormFieldObjectHelper local_68;
  
  local_160 = this;
  analyze(this);
  local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c8._M_impl.super__Rb_tree_header._M_header;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_98._M_impl.super__Rb_tree_header._M_header;
  local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f0 = fields;
  local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
  local_98._M_impl.super__Rb_tree_header._M_header._M_right =
       local_98._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
  list<__gnu_cxx::__normal_iterator<QPDFObjectHandle*,std::vector<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>>,void>
            ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)&local_158,
             (fields->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_start,
             (fields->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&local_208);
  if (local_158._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&local_158) {
    do {
      p_Var5 = local_158._M_impl._M_node.super__List_node_base._M_next;
      local_1c0._16_8_ = local_158._M_impl._M_node.super__List_node_base._M_next + 1;
      og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen((BaseHandle *)local_1c0._16_8_);
      bVar7 = QPDFObjGen::set::add((set *)&local_98,og);
      if (bVar7) {
        local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)
             &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"/Kids","");
        QPDFObjectHandle::getKey(&local_120,(string *)local_1c0._16_8_);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
            &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete(local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        bVar7 = QPDFObjectHandle::isArray(&local_120);
        if (bVar7) {
          QPDFObjectHandle::aitems(&local_120);
          QPDFObjectHandle::QPDFArrayItems::begin
                    ((iterator *)&local_208,(QPDFArrayItems *)local_1d0);
          QPDFObjectHandle::QPDFArrayItems::end(&local_188,(QPDFArrayItems *)local_1d0);
          while (bVar7 = QPDFObjectHandle::QPDFArrayItems::iterator::operator==
                                   ((iterator *)&local_208,&local_188), !bVar7) {
            __args = QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)&local_208);
            p_Var9 = std::__cxx11::list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>>::
                     _M_create_node<QPDFObjectHandle_const&>
                               ((list<QPDFObjectHandle,std::allocator<QPDFObjectHandle>> *)
                                &local_158,__args);
            std::__detail::_List_node_base::_M_hook(&p_Var9->super__List_node_base);
            local_158._M_impl._M_node._M_size = local_158._M_impl._M_node._M_size + 1;
            QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&local_208);
          }
          QPDFObjectHandle::QPDFArrayItems::iterator::~iterator(&local_188);
          QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&local_208);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._8_8_);
          }
        }
        local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
             (_func_int **)
             &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"/T","");
        bVar7 = QPDFObjectHandle::hasKey((QPDFObjectHandle *)local_1c0._16_8_,(string *)&local_208);
        if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
            local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
            &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
          operator_delete(local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                          (ulong)((long)&(local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
        }
        if (bVar7) {
          local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)p_Var5[1]._M_next;
          local_130.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[1]._M_prev;
          if (local_130.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_130.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_130.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_130.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
              _M_use_count = (local_130.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_M_use_count + 1;
            }
          }
          QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_208,&local_130);
          QPDFFormFieldObjectHelper::getFullyQualifiedName_abi_cxx11_
                    ((string *)&local_188,&local_208);
          QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_208);
          if (local_130.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_130.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
            ;
          }
          cVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::find(&local_c8,(key_type *)&local_188);
          if ((_Rb_tree_header *)cVar10._M_node == &local_c8._M_impl.super__Rb_tree_header) {
            local_1d0._0_8_ = local_1c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_1d0,local_188._vptr_iterator,
                       (undefined1 *)
                       ((long)&(((_Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                                  *)local_188._vptr_iterator)->
                               super__Move_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                               ).
                               super__Copy_assign_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                               .
                               super__Move_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                               .
                               super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                               .
                               super__Variant_storage_alias<std::__cxx11::basic_string<char>,_QPDFObject::JSON_Descr,_QPDFObject::ChildDescr,_QPDFObject::ObjStreamDescr>
                       + (long)&(local_188.m.
                                 super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->oh));
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            local_228._M_string_length = 0;
            local_228.field_2._M_allocated_capacity =
                 local_228.field_2._M_allocated_capacity & 0xffffffffffffff00;
            uVar8 = 0;
            while( true ) {
              getFieldsWithQualifiedName
                        ((set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> *)
                         &local_208,local_160,(string *)local_1d0);
              peVar4 = local_208.m.
                       super___shared_ptr<QPDFFormFieldObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
              std::
              _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
              ::~_Rb_tree((_Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
                           *)&local_208);
              if (peVar4 == (element_type *)0x0) break;
              __val = uVar8 + 1;
              __len = 1;
              p_Var1 = &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
              if (8 < uVar8) {
                uVar8 = __val;
                uVar6 = 4;
                do {
                  __len = uVar6;
                  if (uVar8 < 100) {
                    __len = __len - 2;
                    goto LAB_0015045a;
                  }
                  if (uVar8 < 1000) {
                    __len = __len - 1;
                    goto LAB_0015045a;
                  }
                  if (uVar8 < 10000) goto LAB_0015045a;
                  bVar7 = 99999 < uVar8;
                  uVar8 = uVar8 / 10000;
                  uVar6 = __len + 4;
                } while (bVar7);
                __len = __len + 1;
              }
LAB_0015045a:
              local_1c0._24_8_ = &local_198;
              std::__cxx11::string::_M_construct((ulong)(local_1c0 + 0x18),(char)__len);
              std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1c0._24_8_,__len,__val);
              plVar11 = (long *)std::__cxx11::string::replace
                                          ((ulong)(local_1c0 + 0x18),0,(char *)0x0,0x27a476);
              plVar13 = plVar11 + 2;
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar11 ==
                  (__shared_count<(__gnu_cxx::_Lock_policy)2> *)plVar13) {
                local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar13;
                local_208.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)plVar11[3];
                local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
              }
              else {
                local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar13;
                local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)*plVar11;
              }
              local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)plVar11[1];
              *plVar11 = (long)plVar13;
              plVar11[1] = 0;
              *(undefined1 *)(plVar11 + 2) = 0;
              std::__cxx11::string::operator=((string *)&local_228,(string *)&local_208);
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
                operator_delete(local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                (ulong)((long)&(local_208.super_QPDFObjectHelper.super_BaseHandle.
                                                obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1c0._24_8_ != &local_198) {
                operator_delete((void *)local_1c0._24_8_,local_198._M_allocated_capacity + 1);
              }
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_208,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_188,&local_228);
              std::__cxx11::string::operator=((string *)local_1d0,(string *)&local_208);
              uVar8 = __val;
              if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                  local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
                operator_delete(local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                                (ulong)((long)&(local_208.super_QPDFObjectHelper.super_BaseHandle.
                                                obj.
                                                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
              }
            }
            pmVar12 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&local_c8,(key_type *)&local_188);
            std::__cxx11::string::_M_assign((string *)pmVar12);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if ((element_type *)local_1d0._0_8_ != (element_type *)local_1c0) {
              operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
            }
          }
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&local_c8,(key_type *)&local_188);
          local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
               (_func_int **)
               &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          pcVar2 = (pmVar12->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_208,pcVar2,pcVar2 + pmVar12->_M_string_length);
          if (local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            local_1d0._0_8_ = local_1c0;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1d0,"/T","");
            local_110[0] = local_100;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"/T","");
            QPDFObjectHandle::getKey(&local_e8,(string *)local_1c0._16_8_);
            QPDFObjectHandle::getUTF8Value_abi_cxx11_((string *)(local_1c0 + 0x18),&local_e8);
            plVar11 = (long *)std::__cxx11::string::_M_append
                                        ((char *)(local_1c0 + 0x18),
                                         (ulong)local_208.super_QPDFObjectHelper.
                                                _vptr_QPDFObjectHelper);
            local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
            puVar14 = (ulong *)(plVar11 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar11 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar14) {
              local_228.field_2._M_allocated_capacity = *puVar14;
              local_228.field_2._8_8_ = plVar11[3];
            }
            else {
              local_228.field_2._M_allocated_capacity = *puVar14;
              local_228._M_dataplus._M_p = (pointer)*plVar11;
            }
            local_228._M_string_length = plVar11[1];
            *plVar11 = (long)puVar14;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            QPDFObjectHandle::newUnicodeString(&local_d8,&local_228);
            QPDFObjectHandle::replaceKey
                      ((QPDFObjectHandle *)local_1c0._16_8_,(string *)local_1d0,&local_d8);
            if (local_d8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_d8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._24_8_ != &local_198) {
              operator_delete((void *)local_1c0._24_8_,local_198._M_allocated_capacity + 1);
            }
            if (local_e8.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_e8.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            if (local_110[0] != local_100) {
              operator_delete(local_110[0],local_100[0] + 1);
            }
            if ((element_type *)local_1d0._0_8_ != (element_type *)local_1c0) {
              operator_delete((void *)local_1d0._0_8_,local_1c0._0_8_ + 1);
            }
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper !=
              &local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount) {
            operator_delete(local_208.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                            (ulong)((long)&(local_208.super_QPDFObjectHelper.super_BaseHandle.obj.
                                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_188._vptr_iterator !=
              &local_188.m.
               super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount) {
            operator_delete(local_188._vptr_iterator,
                            (ulong)((long)&(local_188.m.
                                            super___shared_ptr<QPDFObjectHandle::QPDFArrayItems::iterator::Members,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
          }
        }
        if (local_120.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_120.super_BaseHandle.obj.
                     super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
        }
      }
      std::__cxx11::list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_erase
                ((list<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_158,
                 (iterator)local_158._M_impl._M_node.super__List_node_base._M_next);
    } while (local_158._M_impl._M_node.super__List_node_base._M_next !=
             (_List_node_base *)&local_158);
  }
  std::__cxx11::_List_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::_M_clear
            (&local_158);
  pQVar15 = (local_f0->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pQVar3 = (local_f0->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  if (pQVar15 != pQVar3) {
    do {
      local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pQVar15->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (pQVar15->super_BaseHandle).obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_140.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi)->_M_use_count =
               (local_140.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
               _M_use_count + 1;
        }
      }
      QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper(&local_68,&local_140);
      addFormField(local_160,&local_68);
      QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper(&local_68);
      if (local_140.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_140.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      pQVar15 = pQVar15 + 1;
    } while (pQVar15 != pQVar3);
  }
  std::
  _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
  ::~_Rb_tree(&local_98);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_c8);
  return;
}

Assistant:

void
QPDFAcroFormDocumentHelper::addAndRenameFormFields(std::vector<QPDFObjectHandle> fields)
{
    analyze();
    std::map<std::string, std::string> renames;
    QPDFObjGen::set seen;
    for (std::list<QPDFObjectHandle> queue{fields.begin(), fields.end()}; !queue.empty();
         queue.pop_front()) {
        auto& obj = queue.front();
        if (seen.add(obj)) {
            auto kids = obj.getKey("/Kids");
            if (kids.isArray()) {
                for (auto const& kid: kids.aitems()) {
                    queue.push_back(kid);
                }
            }

            if (obj.hasKey("/T")) {
                // Find something we can append to the partial name that makes the fully qualified
                // name unique. When we find something, reuse the same suffix for all fields in this
                // group with the same name. We can only change the name of fields that have /T, and
                // this field's /T is always at the end of the fully qualified name, appending to /T
                // has the effect of appending the same thing to the fully qualified name.
                std::string old_name = QPDFFormFieldObjectHelper(obj).getFullyQualifiedName();
                if (renames.count(old_name) == 0) {
                    std::string new_name = old_name;
                    int suffix = 0;
                    std::string append;
                    while (!getFieldsWithQualifiedName(new_name).empty()) {
                        ++suffix;
                        append = "+" + std::to_string(suffix);
                        new_name = old_name + append;
                    }
                    renames[old_name] = append;
                }
                std::string append = renames[old_name];
                if (!append.empty()) {
                    obj.replaceKey(
                        "/T",
                        QPDFObjectHandle::newUnicodeString(
                            obj.getKey("/T").getUTF8Value() + append));
                }
            }
        }
    }

    for (auto const& i: fields) {
        addFormField(i);
    }
}